

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t right_00;
  string_t left_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  string_t *psVar4;
  string_t *psVar5;
  int *piVar6;
  byte in_CL;
  Vector *in_RDX;
  idx_t in_RSI;
  int *result_data;
  string_t *rdata;
  string_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  psVar4 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xbd7314);
  psVar5 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xbd7323);
  piVar6 = ConstantVector::GetData<int>((Vector *)0xbd7332);
  bVar2 = ConstantVector::IsNull((Vector *)0xbd7341);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0xbd734f), !bVar2)) {
    mask = *(ValidityMask **)&psVar4->value;
    fun_00 = (undefined1)((ulong)*(undefined8 *)((long)&psVar4->value + 8) >> 0x38);
    ConstantVector::Validity(in_RDX);
    left_00.value._8_7_ = in_stack_ffffffffffffffe0;
    left_00.value._0_8_ = psVar4;
    left_00.value.inlined.inlined[0xb] = bVar1;
    right_00.value.pointer.ptr = (char *)psVar5;
    right_00.value._0_8_ = piVar6;
    iVar3 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitPositionOperator,duckdb::string_t,duckdb::string_t,int>
                      ((bool)fun_00,left_00,right_00,mask,in_RSI);
    *piVar6 = iVar3;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}